

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

CATNClosure * __thiscall
Centaurus::CompositeATN<wchar_t>::build_root_closure
          (CATNClosure *__return_storage_ptr__,CompositeATN<wchar_t> *this,ATNPath *path)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer ppVar3;
  pointer pwVar4;
  CATNNode<wchar_t> *pCVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pNVar8;
  uint color;
  ATNPath path_1;
  ATNStateStack stack;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  wchar_t local_98 [4];
  ATNPath local_88;
  ATNStateStack local_68;
  vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_> local_48
  ;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._vptr_ATNPath = (_func_int **)&PTR__ATNPath_0019fa40;
  pCVar5 = get_node(this,path);
  pNVar8 = (pCVar5->m_transitions).
           super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pCVar5->m_transitions).
      super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar8) {
    color = 1;
    uVar6 = 0;
    do {
      if (pNVar8[uVar6].m_label.m_ranges.
          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          pNVar8[uVar6].m_label.m_ranges.
          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("transitions[i].is_epsilon()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/CompositeATN.hpp"
                      ,0x225,
                      "CATNClosure Centaurus::CompositeATN<wchar_t>::build_root_closure(const ATNPath &) const [TCHAR = wchar_t]"
                     );
      }
      iVar2 = pNVar8[uVar6].m_dest;
      std::
      vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ::vector(&local_88.
                super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ,&path->
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              );
      local_88._vptr_ATNPath = (_func_int **)&PTR__ATNPath_0019fa40;
      local_88.
      super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      .
      super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].second = iVar2;
      ppVar3 = (path->
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ).
               super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_b0 = (undefined1  [8])&PTR__Identifier_0019ece0;
      pwVar4 = ppVar3[-1].first.m_id._M_dataplus._M_p;
      local_a8._M_p = local_98;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_a8,pwVar4,pwVar4 + ppVar3[-1].first.m_id._M_string_length);
      PriorityChain::PriorityChain
                ((PriorityChain *)&local_48,(Identifier *)local_b0,
                 (path->
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ).
                 super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].second,
                 (pCVar5->m_transitions).
                 super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].m_tag);
      build_closure_inclusive
                (this,__return_storage_ptr__,&local_88,color,&local_68,(PriorityChain *)&local_48);
      std::vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
      ::~vector(&local_48);
      local_b0 = (undefined1  [8])&PTR__Identifier_0019ece0;
      if (local_a8._M_p != local_98) {
        operator_delete(local_a8._M_p);
      }
      std::
      vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ::~vector(&local_88.
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               );
      uVar6 = (ulong)color;
      pNVar8 = (pCVar5->m_transitions).
               super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(pCVar5->m_transitions).
                     super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 3) *
              0x6db6db6db6db6db7;
      color = color + 1;
    } while (uVar6 <= uVar7 && uVar7 - uVar6 != 0);
  }
  std::
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ::~vector(&local_68.
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           );
  return __return_storage_ptr__;
}

Assistant:

CATNClosure build_root_closure(const ATNPath& path) const
    {
        CATNClosure closure;

        ATNStateStack stack;

        const CATNNode<TCHAR>& root_node = get_node(path);

        const std::vector<CATNTransition<TCHAR> >& transitions = root_node.get_transitions();

        for (unsigned int i = 0; i < transitions.size(); i++)
        {
            //All transitions originating from the root node must be epsilon transitions
            assert(transitions[i].is_epsilon());

            build_closure_inclusive(closure, path.replace_index(transitions[i].dest()), i + 1, stack, PriorityChain(path.leaf_id(), path.leaf_index(), transitions[i].tag()));
        }

        return closure;
    }